

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall
re2::NFA::AddToThreadq(NFA *this,Threadq *q,int id0,int c,int flag,char *p,Thread *t0)

{
  int iVar1;
  AddState *pAVar2;
  Inst *pIVar3;
  char **ppcVar4;
  bool bVar5;
  Thread *pTVar6;
  iterator iVar7;
  ostream *poVar8;
  Thread *pTVar9;
  char **ppcVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint i;
  int iVar14;
  ulong local_1f0;
  LogMessage local_1b0;
  
  if (id0 != 0) {
    pAVar2 = this->astack_;
    pAVar2->id = id0;
    pAVar2->t = (Thread *)0x0;
    local_1f0 = 1;
    do {
      if (this->nastack_ < (int)local_1f0) {
        __assert_fail("(nstk) <= (nastack_)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                      0xd8,
                      "void re2::NFA::AddToThreadq(Threadq *, int, int, int, const char *, Thread *)"
                     );
      }
      local_1f0 = (ulong)((int)local_1f0 - 1);
      i = pAVar2[local_1f0].id;
      pTVar9 = pAVar2[local_1f0].t;
      do {
        pTVar6 = t0;
        if ((pTVar9 != (Thread *)0x0) && (pTVar6 = pTVar9, t0 != (Thread *)0x0)) {
          iVar14 = (t0->field_0).ref;
          iVar11 = iVar14 + -1;
          (t0->field_0).ref = iVar11;
          if (iVar14 < 2) {
            if (iVar11 != 0) {
              __assert_fail("(t->ref) == (0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                            ,0xb7,"void re2::NFA::Decref(Thread *)");
            }
            t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
            this->free_threads_ = t0;
          }
        }
        t0 = pTVar6;
        if (i == 0) {
          bVar5 = false;
          i = 0;
          goto switchD_0013eceb_caseD_7;
        }
        if ((int)i < 0) {
          __assert_fail("(i) >= (0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                        ,0x134,
                        "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
                       );
        }
        if (q->max_size_ <= (int)i) {
          __assert_fail("(i) < (max_size_)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                        ,0x135,
                        "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
                       );
        }
        if (((i < (uint)q->max_size_) && ((uint)q->sparse_to_dense_[i] < (uint)q->size_)) &&
           ((q->dense_).
            super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
            ._M_impl.super__Vector_impl_data._M_start[q->sparse_to_dense_[i]].index_ == i))
        goto LAB_0013eef3;
        bVar5 = false;
        SparseArray<re2::NFA::Thread_*>::set_new(q,i,(Thread *)0x0);
        iVar7 = SparseArray<re2::NFA::Thread_*>::find(q,i);
        pIVar3 = this->prog_->inst_;
        uVar12 = pIVar3[i].out_opcode_;
        iVar11 = (int)local_1f0;
        switch(uVar12 & 7) {
        case 0:
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                     0xf7,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"unhandled ",10);
          poVar8 = (ostream *)
                   std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar3[i].out_opcode_ & 7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," in AddToThreadq",0x10);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
          bVar5 = false;
          break;
        case 1:
          if (t0 == (Thread *)0x0) goto LAB_0013f02f;
          (t0->field_0).ref = (t0->field_0).ref + 1;
          (iVar7._M_current)->second = t0;
          if ((pIVar3[i].out_opcode_ & 8) != 0) {
            __assert_fail("!ip->last()",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                          ,0x102,
                          "void re2::NFA::AddToThreadq(Threadq *, int, int, int, const char *, Thread *)"
                         );
          }
          goto LAB_0013edcf;
        case 2:
          uVar12 = c;
          if (pIVar3[i].field_1.field_3.foldcase_ != '\0') {
            uVar12 = c | 0x20;
          }
          if (0x19 < c - 0x41U) {
            uVar12 = c;
          }
          if (((int)(uint)pIVar3[i].field_1.field_3.lo_ <= (int)uVar12) &&
             ((int)uVar12 <= (int)(uint)pIVar3[i].field_1.field_3.hi_))
          goto switchD_0013eceb_caseD_5;
          goto LAB_0013eda7;
        case 3:
          if ((uVar12 & 8) == 0) {
            local_1f0 = (ulong)(iVar11 + 1);
            pAVar2[iVar11].id = i + 1;
            pAVar2[iVar11].t = (Thread *)0x0;
          }
          if ((pIVar3[i].out_opcode_ & 7) != 3) {
            __assert_fail("(opcode()) == (kInstCapture)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                          ,0x6e,"int re2::Prog::Inst::cap()");
          }
          iVar11 = pIVar3[i].field_1.cap_;
          if (iVar11 < this->ncapture_) {
            iVar14 = (int)local_1f0;
            pAVar2[iVar14].id = 0;
            pAVar2[iVar14].t = t0;
            pTVar9 = this->free_threads_;
            if (pTVar9 == (Thread *)0x0) {
              pTVar9 = (Thread *)operator_new(0x10);
              (pTVar9->field_0).ref = 1;
              uVar13 = (long)this->ncapture_ * 8;
              if ((long)this->ncapture_ < 0) {
                uVar13 = 0xffffffffffffffff;
              }
              ppcVar10 = (char **)operator_new__(uVar13);
              pTVar9->capture = ppcVar10;
            }
            else {
              this->free_threads_ = (Thread *)pTVar9->field_0;
              (pTVar9->field_0).ref = 1;
            }
            iVar1 = this->ncapture_;
            if (0 < (long)iVar1) {
              ppcVar10 = pTVar9->capture;
              ppcVar4 = t0->capture;
              uVar13 = 0;
              do {
                ppcVar10[uVar13] = ppcVar4[uVar13];
                ppcVar10[uVar13 + 1] = ppcVar4[uVar13 + 1];
                uVar13 = uVar13 + 2;
              } while (uVar13 < (ulong)(long)iVar1);
            }
            local_1f0 = (ulong)(iVar14 + 1);
            pTVar9->capture[iVar11] = p;
            t0 = pTVar9;
          }
          i = pIVar3[i].out_opcode_ >> 4;
          bVar5 = true;
          pTVar9 = (Thread *)0x0;
          break;
        case 4:
          if ((uVar12 & 8) == 0) {
            local_1f0 = (ulong)(iVar11 + 1);
            pAVar2[iVar11].id = i + 1;
            pAVar2[iVar11].t = (Thread *)0x0;
          }
          if ((pIVar3[i].out_opcode_ & 7) != 4) {
            __assert_fail("(opcode()) == (kInstEmptyWidth)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                          ,0x73,"EmptyOp re2::Prog::Inst::empty()");
          }
          if ((pIVar3[i].field_1.out1_ & ~flag) != 0) goto LAB_0013eef3;
          i = pIVar3[i].out_opcode_ >> 4;
          goto LAB_0013ee0d;
        case 5:
switchD_0013eceb_caseD_5:
          if (t0 == (Thread *)0x0) {
LAB_0013f02f:
            __assert_fail("t != __null",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                          ,0xac,"NFA::Thread *re2::NFA::Incref(Thread *)");
          }
          (t0->field_0).ref = (t0->field_0).ref + 1;
          (iVar7._M_current)->second = t0;
LAB_0013eda7:
          if ((pIVar3[i].out_opcode_ & 8) == 0) {
LAB_0013edcf:
            i = i + 1;
            goto LAB_0013ee0d;
          }
LAB_0013eef3:
          bVar5 = false;
          goto switchD_0013eceb_caseD_7;
        case 6:
          if ((uVar12 & 8) == 0) {
            local_1f0 = (ulong)(iVar11 + 1);
            pAVar2[iVar11].id = i + 1;
            pAVar2[iVar11].t = (Thread *)0x0;
          }
          i = pIVar3[i].out_opcode_ >> 4;
LAB_0013ee0d:
          bVar5 = true;
          pTVar9 = (Thread *)0x0;
switchD_0013eceb_caseD_7:
          break;
        case 7:
          goto switchD_0013eceb_caseD_7;
        }
      } while (bVar5);
    } while (0 < (int)local_1f0);
  }
  return;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, int flag,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use astack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = astack_;
  int nstk = 0;

  stk[nstk++] = AddState(id0);
  while (nstk > 0) {
    DCHECK_LE(nstk, nastack_);
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      if (Debug)
        fprintf(stderr, "  [%d%s]\n", id, FormatCapture(t0->capture).c_str());
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);

    Thread** tp = &q->find(id)->second;
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = AddState(id+1);
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      // Continue on.
      a = AddState(ip->out());
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = AddState(0, t0);

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = AddState(ip->out());
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;
      // Fallthrough intended.

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (Debug)
        fprintf(stderr, " + %d%s\n", id, FormatCapture(t0->capture).c_str());

    Next:
      if (ip->last())
        break;
      a = AddState(id+1);
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = AddState(id+1);

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~flag)
        break;
      a = AddState(ip->out());
      goto Loop;
    }
  }
}